

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 1080.cpp
# Opt level: O0

void btf(int st)

{
  bool bVar1;
  reference pvVar2;
  ulong uVar3;
  size_type sVar4;
  reference pvVar5;
  int local_78;
  int local_74;
  int to;
  int i;
  int v;
  undefined1 local_60 [8];
  queue<int,_std::deque<int,_std::allocator<int>_>_> q;
  int st_local;
  
  q.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish._M_node.
  _4_4_ = st;
  std::queue<int,std::deque<int,std::allocator<int>>>::
  queue<std::deque<int,std::allocator<int>>,void>
            ((queue<int,std::deque<int,std::allocator<int>>> *)local_60);
  std::queue<int,_std::deque<int,_std::allocator<int>_>_>::push
            ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)local_60,
             (value_type *)
             ((long)&q.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data
                     ._M_finish._M_node + 4));
  colors[q.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
         _M_node._4_4_] = 0;
  do {
    bVar1 = std::queue<int,_std::deque<int,_std::allocator<int>_>_>::empty
                      ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)local_60);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      std::queue<int,_std::deque<int,_std::allocator<int>_>_>::~queue
                ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)local_60);
      return;
    }
    pvVar2 = std::queue<int,_std::deque<int,_std::allocator<int>_>_>::front
                       ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)local_60);
    to = *pvVar2;
    std::queue<int,_std::deque<int,_std::allocator<int>_>_>::pop
              ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)local_60);
    for (local_74 = 0; uVar3 = (ulong)local_74,
        sVar4 = std::vector<int,_std::allocator<int>_>::size(edge + to), uVar3 < sVar4;
        local_74 = local_74 + 1) {
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](edge + to,(long)local_74);
      local_78 = *pvVar5;
      if (colors[to] == colors[local_78]) {
        std::operator<<((ostream *)&std::cout,"-1");
        exit(0);
      }
      if (colors[local_78] == -1) {
        colors[local_78] = (uint)(colors[to] == 0);
        std::queue<int,_std::deque<int,_std::allocator<int>_>_>::push
                  ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)local_60,&local_78);
      }
    }
  } while( true );
}

Assistant:

void btf(int st) {
    std::queue<int> q;
    q.push(st);
    colors[st] = 0;

    while (!q.empty()) {
        int v = q.front();
        q.pop();
        for (int i = 0; i < edge[v].size(); ++i) {
            int to = edge[v][i];
            if (colors[v] == colors[to]) {
                std::cout << "-1";
                exit(0);
            }
            if (colors[to] == -1) {
                colors[to] = colors[v] == 0 ? 1 : 0;
                q.push(to);
            }
        }
    }
}